

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O0

int Mpm_CutCompareArea(Mpm_Uni_t *pOld,Mpm_Uni_t *pNew)

{
  Mpm_Uni_t *pNew_local;
  Mpm_Uni_t *pOld_local;
  
  if (pOld->mArea == pNew->mArea) {
    if (*(uint *)&(pOld->pCut).field_0x4 >> 0x1b == *(uint *)&(pNew->pCut).field_0x4 >> 0x1b) {
      if (pOld->mEdge == pNew->mEdge) {
        if (pOld->mAveRefs == pNew->mAveRefs) {
          if (pOld->mTime == pNew->mTime) {
            pOld_local._4_4_ = 0;
          }
          else {
            pOld_local._4_4_ = pOld->mTime - pNew->mTime;
          }
        }
        else {
          pOld_local._4_4_ = pOld->mAveRefs - pNew->mAveRefs;
        }
      }
      else {
        pOld_local._4_4_ = pOld->mEdge - pNew->mEdge;
      }
    }
    else {
      pOld_local._4_4_ =
           (*(uint *)&(pOld->pCut).field_0x4 >> 0x1b) - (*(uint *)&(pNew->pCut).field_0x4 >> 0x1b);
    }
  }
  else {
    pOld_local._4_4_ = pOld->mArea - pNew->mArea;
  }
  return pOld_local._4_4_;
}

Assistant:

int Mpm_CutCompareArea( Mpm_Uni_t * pOld, Mpm_Uni_t * pNew )
{
    if ( pOld->mArea        != pNew->mArea         ) return pOld->mArea        - pNew->mArea;
    if ( pOld->pCut.nLeaves != pNew->pCut.nLeaves  ) return pOld->pCut.nLeaves - pNew->pCut.nLeaves;
    if ( pOld->mEdge        != pNew->mEdge         ) return pOld->mEdge        - pNew->mEdge;
    if ( pOld->mAveRefs     != pNew->mAveRefs      ) return pOld->mAveRefs     - pNew->mAveRefs;
    if ( pOld->mTime        != pNew->mTime         ) return pOld->mTime        - pNew->mTime;
    return 0;
}